

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
peek(Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this)

{
  size_t sVar1;
  runtime_error *this_00;
  uint uVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  ParseLocation l;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
  local_50;
  
  if (this->future == 0) {
    (*(this->super_RefCount)._vptr_RefCount[5])(&l,this);
    (*(this->super_RefCount)._vptr_RefCount[4])(&local_90,this);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_embree::ParseLocation_&,_true>
              (&local_50,&local_90,&l);
    std::__cxx11::string::~string((string *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&l.fileName.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    sVar3 = this->past;
    sVar1 = this->future;
    if (sVar1 + sVar3 == 0x400) {
      if (sVar3 == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"stream buffer empty");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = (int)this->start + 1U & 0x3ff;
      this->start = (ulong)uVar2;
      sVar3 = sVar3 - 1;
      this->past = sVar3;
    }
    else {
      uVar2 = (uint)this->start;
    }
    this->future = sVar1 + 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
                 *)((long)&(((this->buffer).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
                   (ulong)(((int)sVar3 + uVar2 + (int)sVar1 & 0x3ff) << 6)),&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>
    ::~pair(&local_50);
  }
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&(((this->buffer).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::ParseLocation>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p +
         (ulong)(((int)this->past + (int)this->start & 0x3ffU) << 6));
}

Assistant:

const T& peek() {
      if (future == 0) push_back(nextHelper());
      return buffer[(start+past)%BUF_SIZE].first;
    }